

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::bt_peer_connection::write_piece
          (bt_peer_connection *this,peer_request *r,disk_buffer_holder *buffer)

{
  _Atomic_word *p_Var1;
  _Rb_tree_header *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  pointer pdVar5;
  pointer pdVar6;
  session_settings *psVar7;
  byte bVar8;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  undefined8 uVar16;
  long *plVar17;
  int val;
  uint uVar18;
  int iVar19;
  int iVar20;
  list_type *this_00;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *pvVar21;
  _Base_ptr p_Var22;
  alert_manager *paVar23;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  torrent *this_01;
  disk_buffer_holder *this_02;
  uint uVar24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  int *piVar25;
  bool bVar26;
  bool bVar27;
  span<const_char> buf;
  span<const_char> buf_00;
  span<const_char> buf_01;
  vector<char,_std::allocator<char>_> piece_list_buf;
  char msg [17];
  entry piece_list;
  map<int,_libtorrent::digest32<160L>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
  merkle_node_list;
  undefined1 local_158 [16];
  long local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  int *local_118;
  size_type local_110;
  undefined4 local_108;
  undefined1 local_104;
  undefined4 local_103;
  undefined4 local_ff;
  undefined4 local_fb;
  peer_request *local_e8;
  disk_buffer_holder *local_e0;
  undefined1 local_d8 [8];
  bool local_d0;
  undefined7 uStack_cf;
  _Rb_tree<int,_std::pair<const_int,_libtorrent::digest32<160L>_>,_std::_Select1st<std::pair<const_int,_libtorrent::digest32<160L>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
  local_a0;
  disk_buffer_holder local_70;
  disk_buffer_holder local_50;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  
  p_Var3 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
           super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_e0 = buffer;
  if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this_01 = (torrent *)0x0;
    this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_01 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
              super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
    }
    iVar19 = p_Var3->_M_use_count;
    do {
      if (iVar19 == 0) {
        this_01 = (torrent *)0x0;
        this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_0021c9f1;
      }
      LOCK();
      iVar20 = p_Var3->_M_use_count;
      bVar26 = iVar19 == iVar20;
      if (bVar26) {
        p_Var3->_M_use_count = iVar19 + 1;
        iVar20 = iVar19;
      }
      iVar19 = iVar20;
      UNLOCK();
    } while (!bVar26);
    this_03 = p_Var3;
    if (p_Var3->_M_use_count == 0) {
      this_01 = (torrent *)0x0;
    }
LAB_0021c9f1:
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar19 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar19 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar19 + -1;
    }
    if (iVar19 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
    }
  }
  peVar4 = (this_01->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pdVar5 = (peVar4->m_merkle_tree).
           super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar6 = (peVar4->m_merkle_tree).
           super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar19 = r->start;
  uVar18 = r->length + 9;
  uVar13 = (ushort)((uVar18 & 0xff00ff) >> 0x10);
  uVar14 = (ushort)(uVar18 >> 8) & 0xff;
  uVar15 = (ushort)(uVar18 & 0xff00ff);
  bVar9 = (byte)(uVar18 >> 0x18);
  uVar12 = (ushort)bVar9;
  bVar8 = (uVar12 != 0) * (uVar12 < 0x100) * bVar9 - (0xff < uVar12);
  bVar9 = ((uVar18 & 0xff0000) != 0) * (uVar13 < 0x100) * (char)(uVar18 >> 0x10) - (0xff < uVar13);
  bVar10 = ((uVar18 & 0xff00) != 0) * (uVar14 < 0x100) * (char)(uVar18 >> 8) - (0xff < uVar14);
  bVar11 = ((uVar18 & 0xff) != 0) * (uVar15 < 0x100) * (char)uVar18 - (0xff < uVar15);
  local_108 = CONCAT13((bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11),
                       CONCAT12((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10),
                                CONCAT11((bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9),
                                         (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8))));
  psVar7 = (this->super_peer_connection).super_peer_connection_hot_members.m_settings;
  local_d8 = (undefined1  [8])&psVar7->m_mutex;
  local_d0 = false;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_d8);
  local_118 = &r->length;
  bVar26 = pdVar5 != pdVar6;
  bVar27 = iVar19 == 0;
  local_d0 = true;
  local_104 = 0xfa;
  if (!bVar27 || !bVar26) {
    local_104 = 7;
  }
  if (((psVar7->m_store).m_bools.super__Base_bitset<2UL>._M_w[0] >> 0x36 & 1) == 0) {
    local_104 = 7;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_d8);
  uVar18 = (r->piece).m_val;
  uVar13 = (ushort)(uVar18 >> 0x10) & 0xff;
  uVar14 = (ushort)(uVar18 >> 8) & 0xff;
  uVar15 = (ushort)uVar18 & 0xff;
  bVar9 = (byte)(uVar18 >> 0x18);
  uVar12 = (ushort)bVar9;
  bVar9 = (uVar12 != 0) * (uVar12 < 0x100) * bVar9 - (0xff < uVar12);
  bVar10 = ((uVar18 & 0xff0000) != 0) * (uVar13 < 0x100) * (char)(uVar18 >> 0x10) - (0xff < uVar13);
  bVar11 = ((uVar18 & 0xff00) != 0) * (uVar14 < 0x100) * (char)(uVar18 >> 8) - (0xff < uVar14);
  bVar8 = ((uVar18 & 0xff) != 0) * (uVar15 < 0x100) * (char)uVar18 - (0xff < uVar15);
  local_103 = CONCAT13((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                       CONCAT12((bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11),
                                CONCAT11((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10)
                                         ,(bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9))))
  ;
  uVar18 = r->start;
  uVar13 = (ushort)(uVar18 >> 0x10) & 0xff;
  uVar14 = (ushort)(uVar18 >> 8) & 0xff;
  uVar15 = (ushort)uVar18 & 0xff;
  bVar9 = (byte)(uVar18 >> 0x18);
  uVar12 = (ushort)bVar9;
  bVar9 = (uVar12 != 0) * (uVar12 < 0x100) * bVar9 - (0xff < uVar12);
  bVar10 = ((uVar18 & 0xff0000) != 0) * (uVar13 < 0x100) * (char)(uVar18 >> 0x10) - (0xff < uVar13);
  bVar11 = ((uVar18 & 0xff00) != 0) * (uVar14 < 0x100) * (char)(uVar18 >> 8) - (0xff < uVar14);
  bVar8 = ((uVar18 & 0xff) != 0) * (uVar15 < 0x100) * (char)uVar18 - (0xff < uVar15);
  local_ff = CONCAT13((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                      CONCAT12((bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11),
                               CONCAT11((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10),
                                        (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9))));
  if (bVar27 && bVar26) {
    local_158 = (undefined1  [16])0x0;
    local_148 = 0;
    entry::entry((entry *)local_d8);
    this_00 = entry::list((entry *)local_d8);
    libtorrent::torrent_info::build_merkle_list
              ((map<int,_libtorrent::digest32<160L>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
                *)&local_a0,
               (this_01->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (piece_index_t)(r->piece).m_val);
    local_e8 = r;
    std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              (this_00,local_a0._M_impl.super__Rb_tree_header._M_node_count);
    p_Var2 = &local_a0._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_a0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
      p_Var22 = local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_138._M_dataplus._M_p._0_4_ = 2;
        std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::
        emplace_back<libtorrent::entry::data_type>(this_00,(data_type *)&local_138);
        pvVar21 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                  entry::list((this_00->
                              super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                              )._M_impl.super__Vector_impl_data._M_finish + -1);
        std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::emplace_back<int_const&>
                  (pvVar21,(int *)(p_Var22 + 1));
        pvVar21 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                  entry::list((this_00->
                              super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                              )._M_impl.super__Vector_impl_data._M_finish + -1);
        local_110 = 0x14;
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        local_138._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_138,(ulong)&local_110);
        local_138.field_2._M_allocated_capacity = local_110;
        *(undefined4 *)(local_138._M_dataplus._M_p + 0x10) =
             *(undefined4 *)((long)&p_Var22[1]._M_left + 4);
        uVar16 = *(undefined8 *)((long)&p_Var22[1]._M_parent + 4);
        *(undefined8 *)local_138._M_dataplus._M_p = *(undefined8 *)&p_Var22[1].field_0x4;
        *(undefined8 *)(local_138._M_dataplus._M_p + 8) = uVar16;
        local_138._M_string_length = local_110;
        local_138._M_dataplus._M_p[local_110] = '\0';
        std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::__cxx11::string>(pvVar21,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22);
      } while ((_Rb_tree_header *)p_Var22 != p_Var2);
    }
    local_138._M_dataplus._M_p = local_158;
    detail::bencode_recursive<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              ((back_insert_iterator<std::vector<char,_std::allocator<char>_>_> *)&local_138,
               (entry *)local_d8);
    piVar25 = local_118;
    uVar18 = local_158._8_4_ - local_158._0_4_;
    uVar13 = (ushort)((uVar18 & 0xff00ff) >> 0x10);
    uVar14 = (ushort)(uVar18 >> 8) & 0xff;
    uVar15 = (ushort)(uVar18 & 0xff00ff);
    bVar9 = (byte)(uVar18 >> 0x18);
    uVar12 = (ushort)bVar9;
    bVar9 = (uVar12 != 0) * (uVar12 < 0x100) * bVar9 - (0xff < uVar12);
    bVar8 = ((uVar18 & 0xff0000) != 0) * (uVar13 < 0x100) * (char)(uVar18 >> 0x10) - (0xff < uVar13)
    ;
    bVar11 = ((uVar18 & 0xff00) != 0) * (uVar14 < 0x100) * (char)(uVar18 >> 8) - (0xff < uVar14);
    bVar10 = ((uVar18 & 0xff) != 0) * (uVar15 < 0x100) * (char)uVar18 - (0xff < uVar15);
    local_fb = CONCAT13((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10),
                        CONCAT12((bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11),
                                 CONCAT11((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                                          (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9))))
    ;
    uVar18 = *local_118 + 0xd + uVar18;
    uVar13 = (ushort)((uVar18 & 0xff00ff) >> 0x10);
    uVar14 = (ushort)(uVar18 >> 8) & 0xff;
    uVar15 = (ushort)(uVar18 & 0xff00ff);
    bVar9 = (byte)(uVar18 >> 0x18);
    uVar12 = (ushort)bVar9;
    bVar9 = (uVar12 != 0) * (uVar12 < 0x100) * bVar9 - (0xff < uVar12);
    bVar10 = ((uVar18 & 0xff0000) != 0) * (uVar13 < 0x100) * (char)(uVar18 >> 0x10) -
             (0xff < uVar13);
    bVar11 = ((uVar18 & 0xff00) != 0) * (uVar14 < 0x100) * (char)(uVar18 >> 8) - (0xff < uVar14);
    bVar8 = ((uVar18 & 0xff) != 0) * (uVar15 < 0x100) * (char)uVar18 - (0xff < uVar15);
    local_108 = CONCAT13((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                         CONCAT12((bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11),
                                  CONCAT11((bVar10 != 0) * (bVar10 < 0x100) * bVar10 -
                                           (0xff < bVar10),
                                           (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9)))
                        );
    buf_00.m_len = 0x11;
    buf_00.m_ptr = (char *)&local_108;
    peer_connection::send_buffer(&this->super_peer_connection,buf_00);
    r = local_e8;
    buf_01.m_len = local_158._8_8_ - local_158._0_8_;
    buf_01.m_ptr = (char *)local_158._0_8_;
    peer_connection::send_buffer(&this->super_peer_connection,buf_01);
    std::
    _Rb_tree<int,_std::pair<const_int,_libtorrent::digest32<160L>_>,_std::_Select1st<std::pair<const_int,_libtorrent::digest32<160L>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
    ::~_Rb_tree(&local_a0);
    entry::~entry((entry *)local_d8);
    if ((void *)local_158._0_8_ != (void *)0x0) {
      operator_delete((void *)local_158._0_8_,local_148 - local_158._0_8_);
    }
  }
  else {
    buf.m_len = 0xd;
    buf.m_ptr = (char *)&local_108;
    peer_connection::send_buffer(&this->super_peer_connection,buf);
    piVar25 = local_118;
  }
  if ((local_e0->m_ref).cookie == 0x7fffffff) {
    this_02 = &local_50;
    disk_buffer_holder::disk_buffer_holder(this_02,local_e0);
    peer_connection::append_send_buffer<libtorrent::disk_buffer_holder>
              (&this->super_peer_connection,this_02,*piVar25);
  }
  else {
    this_02 = &local_70;
    disk_buffer_holder::disk_buffer_holder(this_02,local_e0);
    append_const_send_buffer<libtorrent::disk_buffer_holder>(this,this_02,*piVar25);
  }
  disk_buffer_holder::~disk_buffer_holder(this_02);
  local_d8._0_4_ = (this->super_peer_connection).m_send_buffer.m_bytes - *piVar25;
  std::
  vector<libtorrent::bt_peer_connection::range,std::allocator<libtorrent::bt_peer_connection::range>>
  ::emplace_back<int,int_const&>
            ((vector<libtorrent::bt_peer_connection::range,std::allocator<libtorrent::bt_peer_connection::range>>
              *)&this->m_payloads,(int *)local_d8,piVar25);
  peer_connection::setup_send(&this->super_peer_connection);
  counters::inc_stats_counter((this->super_peer_connection).m_counters,0x5d,1);
  paVar23 = torrent::alerts(this_01);
  if (((paVar23->m_alert_mask)._M_i.m_val & 0x800080) != 0) {
    paVar23 = torrent::alerts(this_01);
    torrent::get_handle((torrent *)local_d8);
    iVar19 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x12])
                       (this);
    iVar20 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0xd])
                       (this);
    uVar18 = (((this_01->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_files).m_piece_length;
    uVar24 = 0x4000;
    if (uVar18 < 0x4000) {
      uVar24 = uVar18;
    }
    if ((int)uVar18 < 1) {
      uVar24 = 0x4000;
    }
    local_a0._M_impl._0_4_ = r->start / (int)uVar24;
    alert_manager::
    emplace_alert<libtorrent::block_uploaded_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::digest32<160l>const&,int,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
              (paVar23,(torrent_handle *)local_d8,
               (basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var,iVar19),
               (digest32<160L> *)CONCAT44(extraout_var_00,iVar20),(int *)&local_a0,&r->piece);
    plVar17 = (long *)CONCAT71(uStack_cf,local_d0);
    if (plVar17 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar25 = (int *)((long)plVar17 + 0xc);
        iVar19 = *piVar25;
        *piVar25 = *piVar25 + -1;
        UNLOCK();
      }
      else {
        iVar19 = *(int *)((long)plVar17 + 0xc);
        *(int *)((long)plVar17 + 0xc) = iVar19 + -1;
      }
      if (iVar19 == 1) {
        (**(code **)(*plVar17 + 0x18))();
      }
    }
  }
  if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
  }
  return;
}

Assistant:

void bt_peer_connection::write_piece(peer_request const& r, disk_buffer_holder buffer)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(m_sent_handshake);
		TORRENT_ASSERT(m_sent_bitfield);

		std::shared_ptr<torrent> t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		bool merkle = t->torrent_file().is_merkle_torrent() && r.start == 0;
	// the hash piece looks like this:
	// uint8_t  msg
	// uint32_t piece index
	// uint32_t start
	// uint32_t list len
	// var      bencoded list
	// var      piece data
		char msg[4 + 1 + 4 + 4 + 4];
		char* ptr = msg;
		TORRENT_ASSERT(r.length <= 16 * 1024);
		detail::write_int32(r.length + 1 + 4 + 4, ptr);
		if (m_settings.get_bool(settings_pack::support_merkle_torrents) && merkle)
			detail::write_uint8(250, ptr);
		else
			detail::write_uint8(msg_piece, ptr);
		detail::write_int32(static_cast<int>(r.piece), ptr);
		detail::write_int32(r.start, ptr);

		// if this is a merkle torrent and the start offset
		// is 0, we need to include the merkle node hashes
		if (merkle)
		{
			std::vector<char> piece_list_buf;
			entry piece_list;
			entry::list_type& l = piece_list.list();
			std::map<int, sha1_hash> merkle_node_list = t->torrent_file().build_merkle_list(r.piece);
			l.reserve(merkle_node_list.size());
			for (auto const& i : merkle_node_list)
			{
				l.emplace_back(entry::list_t);
				l.back().list().emplace_back(i.first);
				l.back().list().emplace_back(i.second.to_string());
			}
			bencode(std::back_inserter(piece_list_buf), piece_list);
			detail::write_int32(int(piece_list_buf.size()), ptr);

			// back-patch the length field
			char* ptr2 = msg;
			detail::write_int32(r.length + 1 + 4 + 4 + 4 + int(piece_list_buf.size())
				, ptr2);

			send_buffer({msg, 17});
			send_buffer(piece_list_buf);
		}
		else
		{
			send_buffer({msg, 13});
		}

		if (buffer.is_mutable())
		{
			append_send_buffer(std::move(buffer), r.length);
		}
		else
		{
			append_const_send_buffer(std::move(buffer), r.length);
		}

		m_payloads.emplace_back(send_buffer_size() - r.length, r.length);
		setup_send();

		stats_counters().inc_stats_counter(counters::num_outgoing_piece);

		if (t->alerts().should_post<block_uploaded_alert>())
		{
			t->alerts().emplace_alert<block_uploaded_alert>(t->get_handle(),
				remote(), pid(), r.start / t->block_size() , r.piece);
		}
	}